

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS TestWhiteSpace(_Bool IsJson5)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  WJTL_STATUS WVar10;
  WJTL_STATUS WVar11;
  WJTL_STATUS WVar12;
  char *pcVar13;
  undefined7 in_register_00000039;
  int iVar14;
  uint64_t local_50 [4];
  
  WVar1 = VerifyJsonParsesAsNumberObjectSigned(IsJson5," 1 ",1);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" 1 \", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4e9);
  WVar2 = VerifyJsonParsesAsNumberObjectSigned(IsJson5,"\t1\t",1);
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \"\\t1\\t\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4ea);
  WVar3 = VerifyJsonParsesAsNumberObjectSigned(IsJson5,"\n1\n",1);
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \"\\n1\\n\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4eb);
  WVar4 = VerifyJsonParsesAsNumberObjectSigned(IsJson5,"\r\n1\r\n",1);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \"\\r\\n1\\r\\n\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x4ec);
  if ((int)CONCAT71(in_register_00000039,IsJson5) == 0) {
    WVar5 = VerifyJsonUnableToParse(false," 1\v",1);
    WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\v\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fb);
    WVar6 = VerifyJsonUnableToParse(false," 1\f",1);
    WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\f\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fc);
    WVar7 = VerifyJsonUnableToParse(false,anon_var_dwarf_20cd,1);
    WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xc2\\xa0\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fd);
    WVar8 = VerifyJsonUnableToParse(false,anon_var_dwarf_20f1,1);
    WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xe2\\x80\\xa8\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4fe);
    WVar7 = WVar7 | WVar8 | WVar6 | WVar5;
    WVar5 = VerifyJsonUnableToParse(false,anon_var_dwarf_2109,1);
    WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xe2\\x80\\xa9\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4ff);
    WVar6 = VerifyJsonUnableToParse(false,anon_var_dwarf_2121,1);
    pcVar13 = 
    "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" 1\\xef\\xbb\\xbf\", 1 ))) == (JL_STATUS_SUCCESS)"
    ;
    iVar14 = 0x500;
  }
  else {
    WVar5 = VerifyJsonParsesAsNumberObjectSigned(true," \v1\v",1);
    WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\v1\\v\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f1);
    WVar6 = VerifyJsonParsesAsNumberObjectSigned(true," \f1\f",1);
    WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\f1\\f\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f2);
    WVar7 = VerifyJsonParsesAsNumberObjectSigned(true,anon_var_dwarf_203d,1);
    WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xc2\\xa0 1 \\xc2\\xa0\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f3);
    WVar8 = VerifyJsonParsesAsNumberObjectSigned(true,anon_var_dwarf_2055,1);
    WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xe2\\x80\\xa8 1 \\xe2\\x80\\xa8\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f4);
    WVar7 = WVar7 | WVar8 | WVar6 | WVar5;
    WVar5 = VerifyJsonParsesAsNumberObjectSigned(true,anon_var_dwarf_206d,1);
    WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xe2\\x80\\xa9 1 \\xe2\\x80\\xa9\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x4f5);
    WVar6 = VerifyJsonParsesAsNumberObjectSigned(true,anon_var_dwarf_2085,1);
    pcVar13 = 
    "((JL_STATUS)(VerifyJsonParsesAsNumberObjectSigned( IsJson5, \" \\xef\\xbb\\xbf 1 \\xef\\xbb\\xbf\", 1 ))) == (JL_STATUS_SUCCESS)"
    ;
    iVar14 = 0x4f6;
  }
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,pcVar13,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",iVar14);
  WVar8 = VerifyJsonParsesAsDictionaryOfNumbers
                    (IsJson5,
                     " {  \t\r\n\"item1\"  \t\r\n:  \t\r\n1,  \t\r\n\"item2\"  \t\r\n:  \t\r\n2  \t\r\n}"
                     ,2);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \"\" \\t\\r\\n\"\"\\\"item1\\\" \"\" \\t\\r\\n\"\": \"\" \\t\\r\\n\"\"1, \"\" \\t\\r\\n\"\"\\\"item2\\\" \"\" \\t\\r\\n\"\": \"\" \\t\\r\\n\"\"2 \"\" \\t\\r\\n\"\"}\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x506);
  local_50[2] = 1;
  local_50[3] = 2;
  WVar9 = VerifyJsonParsesAsListOfNumbers
                    (IsJson5," \t\r\n[ \t\r\n1 \t\r\n, \t\r\n2 \t\r\n] \t\r\n",local_50 + 2,2);
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsListOfNumbers( IsJson5, \"\"\" \\t\\r\\n\"\"[\"\" \\t\\r\\n\"\"1\"\" \\t\\r\\n\"\",\"\" \\t\\r\\n\"\"2\"\" \\t\\r\\n\"\"]\"\" \\t\\r\\n\"\"\", (uint64_t[]){1,2}, 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",0x507);
  if (IsJson5) {
    WVar10 = VerifyJsonParsesAsDictionaryOfNumbers(true,anon_var_dwarf_218d,2);
    WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item1\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1, \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item2\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2 \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"}\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x50a);
    local_50[0] = 1;
    local_50[1] = 2;
    WVar11 = VerifyJsonParsesAsListOfNumbers(true,anon_var_dwarf_21be,local_50,2);
    pcVar13 = 
    "((JL_STATUS)(VerifyJsonParsesAsListOfNumbers( IsJson5, \"\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"[\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\",\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"]\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\", (uint64_t[]){1,2}, 2 ))) == (JL_STATUS_SUCCESS)"
    ;
    iVar14 = 0x50b;
  }
  else {
    WVar10 = VerifyJsonUnableToParse(false,anon_var_dwarf_218d,7);
    WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \" { \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item1\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1, \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\\\"item2\\\" \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\": \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2 \"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"}\", 7 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestWhiteSpace",0x50f);
    WVar11 = VerifyJsonUnableToParse(false,anon_var_dwarf_21be,4);
    pcVar13 = 
    "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"[\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"1\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\",\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"2\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"]\"\" \\t\\r\\n\\xc2\\xa0 \\xe2\\x80\\xa8 \\xe2\\x80\\xa9 \\xef\\xbb\\xbf\"\"\", 4 ))) == (JL_STATUS_SUCCESS)"
    ;
    iVar14 = 0x510;
  }
  WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,pcVar13,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestWhiteSpace",iVar14);
  WVar12 = WJTL_STATUS_FAILED;
  if (((WVar8 == WJTL_STATUS_SUCCESS && WVar9 == WJTL_STATUS_SUCCESS) &&
      (WVar11 == WJTL_STATUS_SUCCESS && WVar10 == WJTL_STATUS_SUCCESS)) &&
      (((WVar2 == WJTL_STATUS_SUCCESS && WVar3 == WJTL_STATUS_SUCCESS) &&
       WVar4 == WJTL_STATUS_SUCCESS) &&
      (WVar1 == WJTL_STATUS_SUCCESS &&
      ((WVar5 == WJTL_STATUS_SUCCESS && WVar6 == WJTL_STATUS_SUCCESS) &&
      WVar7 == WJTL_STATUS_SUCCESS)))) {
    WVar12 = WJTL_STATUS_SUCCESS;
  }
  return WVar12;
}

Assistant:

static
WJTL_STATUS
    TestWhiteSpace
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test ordinary whitespace
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " 1 ", 1 ) );          // Space
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, "\t1\t", 1 ) );        // Tab
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, "\n1\n", 1 ) );        // Line feed
    JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, "\r\n1\r\n", 1 ) );    // Carriage return / Line feed

    // Now test extended json5 whitespace
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \v1\v", 1 ) );             // Vertical tab
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \f1\f", 1 ) );             // Form feed
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xc2\xa0 1 \xc2\xa0", 1 ) );       // Non-breaking space
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xe2\x80\xa8 1 \xe2\x80\xa8", 1 ) );   // Line separator
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xe2\x80\xa9 1 \xe2\x80\xa9", 1 ) );   // Paragraph separator
        JL_ASSERT_SUCCESS(VerifyJsonParsesAsNumberObjectSigned( IsJson5, " \xef\xbb\xbf 1 \xef\xbb\xbf", 1 ) );   // Byte order mark
    }
    else
    {
        // Extended white spaces should fail
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\v", 1 ) );             // Vertical tab
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\f", 1 ) );             // Form feed
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xc2\xa0", 1 ) );       // Non-breaking space
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xe2\x80\xa8", 1 ) );   // Line separator
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xe2\x80\xa9", 1 ) );   // Paragraph separator
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 1\xef\xbb\xbf", 1 ) );   // Byte order mark
    }

    // Now try a more complicated object with all the white spaces used
    #define WSP1 " \t\r\n"
    #define WSP5 " \t\r\n\xc2\xa0 \xe2\x80\xa8 \xe2\x80\xa9 \xef\xbb\xbf"
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { "WSP1"\"item1\" "WSP1": "WSP1"1, "WSP1"\"item2\" "WSP1": "WSP1"2 "WSP1"}", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsListOfNumbers( IsJson5, ""WSP1"["WSP1"1"WSP1","WSP1"2"WSP1"]"WSP1"", (uint64_t[]){1,2}, 2 ) );
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { "WSP5"\"item1\" "WSP5": "WSP5"1, "WSP5"\"item2\" "WSP5": "WSP5"2 "WSP5"}", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsListOfNumbers( IsJson5, ""WSP5"["WSP5"1"WSP5","WSP5"2"WSP5"]"WSP5"", (uint64_t[]){1,2}, 2 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " { "WSP5"\"item1\" "WSP5": "WSP5"1, "WSP5"\"item2\" "WSP5": "WSP5"2 "WSP5"}", 7 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, ""WSP5"["WSP5"1"WSP5","WSP5"2"WSP5"]"WSP5"", 4 ) );
    }
    #undef WSP5
    #undef WSP5

    return TestReturn;
}